

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::registerTestCase
               (ITestCase *testCase,char *classOrQualifiedMethodName,NameAndDesc *nameAndDesc,
               SourceLineInfo *lineInfo)

{
  char *pcVar1;
  NameAndDesc *pNVar2;
  char *_testCase;
  IMutableRegistryHub *pIVar3;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  allocator local_181;
  string local_180;
  string local_160;
  TestCase local_140;
  SourceLineInfo *local_28;
  SourceLineInfo *lineInfo_local;
  NameAndDesc *nameAndDesc_local;
  char *classOrQualifiedMethodName_local;
  ITestCase *testCase_local;
  
  local_28 = lineInfo;
  lineInfo_local = (SourceLineInfo *)nameAndDesc;
  nameAndDesc_local = (NameAndDesc *)classOrQualifiedMethodName;
  classOrQualifiedMethodName_local = (char *)testCase;
  pIVar3 = getMutableRegistryHub();
  _testCase = classOrQualifiedMethodName_local;
  pNVar2 = nameAndDesc_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,(char *)pNVar2,&local_181);
  extractClassName(&local_160,&local_180);
  pcVar1 = *(char **)&lineInfo_local->file;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,pcVar1,&local_1b9);
  pcVar1 = (char *)(lineInfo_local->file)._M_string_length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,pcVar1,&local_1e1);
  makeTestCase(&local_140,(ITestCase *)_testCase,&local_160,&local_1b8,&local_1e0,local_28);
  (*pIVar3->_vptr_IMutableRegistryHub[4])(pIVar3,&local_140);
  TestCase::~TestCase(&local_140);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  return;
}

Assistant:

void registerTestCase
        (   ITestCase* testCase,
            char const* classOrQualifiedMethodName,
            NameAndDesc const& nameAndDesc,
            SourceLineInfo const& lineInfo ) {

        getMutableRegistryHub().registerTest
            ( makeTestCase
                (   testCase,
                    extractClassName( classOrQualifiedMethodName ),
                    nameAndDesc.name,
                    nameAndDesc.description,
                    lineInfo ) );
    }